

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_tag.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnionTagBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference pvVar1;
  pointer pEVar2;
  idx_t capacity;
  reference this_00;
  string *value;
  ParameterNotResolvedException *this_01;
  BinderException *pBVar3;
  InternalException *this_02;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar4;
  idx_t i;
  idx_t index;
  long lVar5;
  anon_union_16_2_67f50693_for_value aVar6;
  string_t data;
  LogicalType enum_type;
  Vector varchar_vector;
  LogicalType local_48;
  
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&varchar_vector,"Missing required arguments for union_tag function.",
               (allocator *)&enum_type);
    BinderException::BinderException(pBVar3,(string *)&varchar_vector);
    __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar4 = arguments;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if ((pEVar2->return_type).id_ == UNKNOWN) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if ((pEVar2->return_type).id_ != UNION) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&varchar_vector,
               "First argument to union_tag function must be a union type.",(allocator *)&enum_type)
    ;
    BinderException::BinderException(pBVar3,(string *)&varchar_vector);
    __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((ulong)((long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(arguments->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar1);
    capacity = UnionType::GetMemberCount(&pEVar2->return_type);
    if (capacity != 0) {
      pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar1);
      this_00 = vector<duckdb::LogicalType,_true>::get<true>
                          (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                            arguments,0);
      LogicalType::operator=(this_00,&pEVar2->return_type);
      LogicalType::LogicalType(&local_48,VARCHAR);
      Vector::Vector(&varchar_vector,&local_48,capacity);
      LogicalType::~LogicalType(&local_48);
      lVar5 = 8;
      for (index = 0; capacity != index; index = index + 1) {
        pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar1);
        value = UnionType::GetMemberName_abi_cxx11_(&pEVar2->return_type,index);
        string_t::string_t((string_t *)&enum_type,value);
        aVar6._4_1_ = enum_type._4_1_;
        aVar6._5_1_ = enum_type._5_1_;
        aVar6._6_1_ = enum_type._6_1_;
        aVar6._7_1_ = enum_type._7_1_;
        aVar6._0_1_ = enum_type.id_;
        aVar6._1_1_ = enum_type.physical_type_;
        aVar6._2_2_ = enum_type._2_2_;
        aVar6.pointer.ptr =
             (char *)enum_type.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (0xc < (uint)enum_type._0_4_) {
          data.value.pointer.ptr = (char *)pvVar4;
          data.value._0_8_ =
               enum_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          aVar6.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddString
                         ((StringVector *)&varchar_vector,
                          (Vector *)CONCAT44(enum_type._4_4_,enum_type._0_4_),data);
        }
        *(long *)(varchar_vector.data + lVar5 + -8) = aVar6._0_8_;
        *(char **)(varchar_vector.data + lVar5) = aVar6.pointer.ptr;
        lVar5 = lVar5 + 0x10;
        pvVar4 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)varchar_vector.data;
      }
      LogicalType::ENUM(&enum_type,&varchar_vector,capacity);
      LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,&enum_type);
      *(undefined8 *)this = 0;
      LogicalType::~LogicalType(&enum_type);
      Vector::~Vector(&varchar_vector);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&varchar_vector,"Can\'t get tags from an empty union",
               (allocator *)&enum_type);
    InternalException::InternalException(this_02,(string *)&varchar_vector);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&varchar_vector,"Too many arguments, union_tag takes at most one argument.",
             (allocator *)&enum_type);
  BinderException::BinderException(pBVar3,(string *)&varchar_vector);
  __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> UnionTagBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {

	if (arguments.empty()) {
		throw BinderException("Missing required arguments for union_tag function.");
	}

	if (LogicalTypeId::UNKNOWN == arguments[0]->return_type.id()) {
		throw ParameterNotResolvedException();
	}

	if (LogicalTypeId::UNION != arguments[0]->return_type.id()) {
		throw BinderException("First argument to union_tag function must be a union type.");
	}

	if (arguments.size() > 1) {
		throw BinderException("Too many arguments, union_tag takes at most one argument.");
	}

	auto member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (member_count == 0) {
		// this should never happen, empty unions are not allowed
		throw InternalException("Can't get tags from an empty union");
	}

	bound_function.arguments[0] = arguments[0]->return_type;

	auto varchar_vector = Vector(LogicalType::VARCHAR, member_count);
	for (idx_t i = 0; i < member_count; i++) {
		auto str = string_t(UnionType::GetMemberName(arguments[0]->return_type, i));
		FlatVector::GetData<string_t>(varchar_vector)[i] =
		    str.IsInlined() ? str : StringVector::AddString(varchar_vector, str);
	}
	auto enum_type = LogicalType::ENUM(varchar_vector, member_count);
	bound_function.return_type = enum_type;

	return nullptr;
}